

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perm.c
# Opt level: O2

void perm_rand(int n,int *arr)

{
  int iVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  
  perm_ident(n,arr);
  iVar3 = 1;
  if (1 < n) {
    iVar3 = n;
  }
  for (uVar4 = 0; iVar3 - 1 != uVar4; uVar4 = uVar4 + 1) {
    iVar1 = rand();
    lVar2 = (long)(iVar1 % n) + uVar4;
    iVar1 = arr[lVar2];
    arr[lVar2] = arr[uVar4];
    arr[uVar4] = iVar1;
    n = n + -1;
  }
  return;
}

Assistant:

void perm_rand(int n, int* arr)
{
	perm_ident(n, arr);
	for (int i = 0; i < n - 1; ++i) {
		int j = i + rand() % (n - i);
		const int sw = arr[j];
		arr[j] = arr[i];
		arr[i] = sw;
	}
}